

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void Catch::loadTestNamesFromFile(ConfigData *config,string *_filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider _Var2;
  char cVar3;
  bool bVar4;
  istream *piVar5;
  long *plVar6;
  domain_error *this;
  size_type *psVar7;
  long local_2c0;
  ifstream f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_78;
  string local_70;
  undefined1 local_50 [8];
  string line;
  
  std::ifstream::ifstream(&local_2c0,(_filename->_M_dataplus)._M_p,_S_in);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    local_50 = (undefined1  [8])&line._M_string_length;
    line._M_dataplus._M_p = (pointer)0x0;
    line._M_string_length._0_1_ = 0;
    paVar1 = &local_70.field_2;
    local_78 = &config->testsOrTags;
    while( true ) {
      cVar3 = std::ios::widen((char)*(undefined8 *)(local_2c0 + -0x18) + (char)(istream *)&local_2c0
                             );
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&local_2c0,(string *)local_50,cVar3);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
      trim(&local_70,(string *)local_50);
      std::__cxx11::string::operator=((string *)local_50,(string *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      _Var2._M_p = line._M_dataplus._M_p;
      if (line._M_dataplus._M_p == (pointer)0x0) {
        bVar4 = false;
      }
      else {
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"#","");
        bVar4 = startsWith((string *)local_50,&local_98);
        bVar4 = !bVar4;
      }
      if ((_Var2._M_p != (pointer)0x0) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2)) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if (bVar4) {
        std::operator+(&local_b8,"\"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                      );
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_b8);
        psVar7 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_70.field_2._M_allocated_capacity = *psVar7;
          local_70.field_2._8_8_ = plVar6[3];
          local_70._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_70.field_2._M_allocated_capacity = *psVar7;
          local_70._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_70._M_string_length = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_78,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
      }
    }
    if (local_50 != (undefined1  [8])&line._M_string_length) {
      operator_delete((void *)local_50);
    }
    std::ifstream::~ifstream(&local_2c0);
    return;
  }
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 "Unable to load input file: ",_filename);
  std::domain_error::domain_error(this,(string *)local_50);
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

inline void loadTestNamesFromFile(ConfigData& config, std::string const& _filename) {
		std::ifstream f(_filename.c_str());
		if (!f.is_open())
			throw std::domain_error("Unable to load input file: " + _filename);

		std::string line;
		while (std::getline(f, line)) {
			line = trim(line);
			if (!line.empty() && !startsWith(line, "#"))
				addTestOrTags(config, "\"" + line + "\",");
		}
	}